

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_00168778;
  std::__cxx11::string::~string((string *)&this->detail);
  std::__cxx11::string::~string((string *)&this->type);
  std::logic_error::~logic_error(&this->super_logic_error);
  return;
}

Assistant:

~Exception() NOEXCEPT {}